

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerTest.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_31d0::LexerTest_indentation_Test::~LexerTest_indentation_Test
          (LexerTest_indentation_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(LexerTest, indentation) {
  StringRef input = "\
|\n\
 | |";
  ninja::Lexer lexer(input);

  // Check that we get an indentation token for whitespace, but only at the
  // start of a line.
  ninja::Token tok;
  lexer.lex(tok);

  // Check first token.
  EXPECT_EQ(ninja::Token::Kind::Pipe, tok.tokenKind);
  EXPECT_EQ(1U, tok.length);
  EXPECT_EQ(1U, tok.line);
  EXPECT_EQ(0U, tok.column);

  // Check second token (the newline).
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::Newline, tok.tokenKind);
  EXPECT_EQ(1U, tok.length);
  EXPECT_EQ(1U, tok.line);
  EXPECT_EQ(1U, tok.column);

  // Check third token (our indentation token).
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::Indentation, tok.tokenKind);
  EXPECT_EQ(1U, tok.length);
  EXPECT_EQ(2U, tok.line);
  EXPECT_EQ(0U, tok.column);

  // Check fourth token (the pipe following indentation).
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::Pipe, tok.tokenKind);
  EXPECT_EQ(1U, tok.length);
  EXPECT_EQ(2U, tok.line);
  EXPECT_EQ(1U, tok.column);

  // Check fifth token (skipping whitespace).
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::Pipe, tok.tokenKind);
  EXPECT_EQ(1U, tok.length);
  EXPECT_EQ(2U, tok.line);
  EXPECT_EQ(3U, tok.column);

  // Check final token.
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::EndOfFile, tok.tokenKind);
}